

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O2

int mk_sched_event_write(mk_sched_conn *conn,mk_sched_worker *sched,mk_server *server)

{
  _func_int_mk_sched_conn_ptr_mk_sched_worker_ptr_mk_server_ptr *p_Var1;
  int iVar2;
  int iVar3;
  size_t count;
  
  iVar2 = mk_channel_write(&conn->channel,&count);
  iVar3 = 0;
  if (iVar2 != 1) {
    if (iVar2 == 4) {
      return 0;
    }
    if (iVar2 == 0x10) {
      return 0;
    }
    if (iVar2 != 8) {
      return -1;
    }
  }
  p_Var1 = conn->protocol->cb_done;
  if (p_Var1 != (_func_int_mk_sched_conn_ptr_mk_sched_worker_ptr_mk_server_ptr *)0x0) {
    iVar2 = (*p_Var1)(conn,sched,server);
  }
  if (iVar2 == -1) {
    iVar3 = -1;
  }
  else if (iVar2 == 0) {
    mk_event_add(sched->loop,(conn->event).fd,3,1,conn);
  }
  return iVar3;
}

Assistant:

int mk_sched_event_write(struct mk_sched_conn *conn,
                         struct mk_sched_worker *sched,
                         struct mk_server *server)
{
    int ret = -1;
    size_t count;
    struct mk_event *event;

    MK_TRACE("[FD %i] Connection Handler / write", conn->event.fd);

    ret = mk_channel_write(&conn->channel, &count);
    if (ret == MK_CHANNEL_FLUSH || ret == MK_CHANNEL_BUSY) {
        return 0;
    }
    else if (ret == MK_CHANNEL_DONE || ret == MK_CHANNEL_EMPTY) {
        if (conn->protocol->cb_done) {
            ret = conn->protocol->cb_done(conn, sched, server);
        }
        if (ret == -1) {
            return -1;
        }
        else if (ret == 0) {
            event = &conn->event;
            mk_event_add(sched->loop, event->fd,
                         MK_EVENT_CONNECTION,
                         MK_EVENT_READ,
                         conn);
        }
        return 0;
    }
    else if (ret & MK_CHANNEL_ERROR) {
        return -1;
    }

    /* avoid to make gcc cry :_( */
    return -1;
}